

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistogramSetResetPointers(VP8LHistogramSet *set,int cache_bits)

{
  uint uVar1;
  int iVar2;
  VP8LHistogram **ppVVar3;
  VP8LHistogram **ppVVar4;
  VP8LHistogram *pVVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar2 = (4 << ((byte)cache_bits & 0x1f)) + 0x1150;
  if (cache_bits < 1) {
    iVar2 = 0x1150;
  }
  ppVVar3 = set->histograms;
  uVar1 = set->max_size;
  ppVVar4 = ppVVar3 + (int)uVar1;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pVVar5 = (VP8LHistogram *)((long)ppVVar4 + 0x1fU & 0xffffffffffffffe0);
    ppVVar3[uVar6] = pVVar5;
    ppVVar3 = set->histograms;
    ppVVar3[uVar6]->literal = (uint32_t *)(pVVar5 + 1);
    ppVVar4 = (VP8LHistogram **)((long)pVVar5->red + (long)iVar2 + -8);
  }
  return;
}

Assistant:

static void HistogramSetResetPointers(VP8LHistogramSet* const set,
                                      int cache_bits) {
  int i;
  const int histo_size = GetHistogramSize(cache_bits);
  uint8_t* memory = (uint8_t*) (set->histograms);
  memory += set->max_size * sizeof(*set->histograms);
  for (i = 0; i < set->max_size; ++i) {
    memory = (uint8_t*) WEBP_ALIGN(memory);
    set->histograms[i] = (VP8LHistogram*) memory;
    // 'literal' won't necessary be aligned.
    set->histograms[i]->literal = (uint32_t*)(memory + sizeof(VP8LHistogram));
    memory += histo_size;
  }
}